

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O3

void perm_table_init(void)

{
  int iVar1;
  int z;
  long lVar2;
  char (*paacVar3) [32] [512];
  char (*pacVar4) [512];
  long lVar5;
  long lVar6;
  
  paacVar3 = perm_table;
  lVar2 = 0;
  do {
    lVar5 = 0;
    pacVar4 = *paacVar3;
    do {
      lVar6 = 0;
      do {
        iVar1 = perm5((int)lVar2,(int)lVar5,(int)lVar6);
        (*(char (*) [512])*pacVar4)[lVar6] = (char)iVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x200);
      lVar5 = lVar5 + 1;
      pacVar4 = pacVar4 + 1;
    } while (lVar5 != 0x20);
    lVar2 = lVar2 + 1;
    paacVar3 = (char (*) [32] [512])((long)paacVar3 + 0x4000);
  } while (lVar2 != 0x20);
  return;
}

Assistant:

void perm_table_init(void)
{
	/* populate perm_table for all possible inputs */
	int z, p_high, p_low;
	for (z = 0; z < 0x20; z++)
		for (p_high = 0; p_high < 0x20; p_high++)
			for (p_low = 0; p_low < 0x200; p_low++)
				perm_table[z][p_high][p_low] = perm5(z, p_high, p_low);
}